

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O3

basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> * __thiscall
jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::at
          (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *this,size_t i)

{
  long lVar1;
  uint uVar2;
  object *this_00;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar3;
  json_runtime_error<std::domain_error,_void> *this_01;
  json_runtime_error<std::out_of_range,_void> *this_02;
  string local_38;
  
  while( true ) {
    uVar2 = (byte)*(object_storage *)this & 0xf;
    if (1 < uVar2 - 8) break;
    this = *(basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> **)((long)this + 8)
    ;
  }
  if (uVar2 == 0xd) {
    this_00 = basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::object_storage::
              value_abi_cxx11_((object_storage *)this);
    pbVar3 = sorted_json_object<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::vector>
             ::at(this_00,i);
    return pbVar3;
  }
  if (uVar2 != 0xe) {
    this_01 = (json_runtime_error<std::domain_error,_void> *)__cxa_allocate_exception(0x18);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"Index on non-array value not supported","");
    json_runtime_error<std::domain_error,_void>::json_runtime_error(this_01,&local_38);
    __cxa_throw(this_01,&json_runtime_error<std::domain_error,void>::typeinfo,
                json_runtime_error<std::domain_error,_void>::~json_runtime_error);
  }
  lVar1 = *(long *)(*(long *)((long)this + 8) + 8);
  if (i < (ulong)(*(long *)(*(long *)((long)this + 8) + 0x10) - lVar1 >> 4)) {
    return (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)(lVar1 + i * 0x10)
    ;
  }
  this_02 = (json_runtime_error<std::out_of_range,_void> *)__cxa_allocate_exception(0x18);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Invalid array subscript","");
  json_runtime_error<std::out_of_range,_void>::json_runtime_error(this_02,&local_38);
  __cxa_throw(this_02,&json_runtime_error<std::out_of_range,void>::typeinfo,
              json_runtime_error<std::out_of_range,_void>::~json_runtime_error);
}

Assistant:

const basic_json& at(std::size_t i) const
        {
            switch (storage_kind())
            {
                case json_storage_kind::array:
                    if (i >= cast<array_storage>().value().size())
                    {
                        JSONCONS_THROW(json_runtime_error<std::out_of_range>("Invalid array subscript"));
                    }
                    return cast<array_storage>().value().operator[](i);
                case json_storage_kind::object:
                    return cast<object_storage>().value().at(i);
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().at(i);
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().at(i);
                default:
                    JSONCONS_THROW(json_runtime_error<std::domain_error>("Index on non-array value not supported"));
            }
        }